

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

Cba_Man_t * Cba_ManCollapse(Cba_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  Hash_IntMan_t *vHash;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Nam_t *pAVar5;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pMods;
  Cba_Man_t *p_01;
  Vec_Int_t *p_02;
  int *piVar6;
  Cba_Ntk_t *p_03;
  char *pcVar7;
  long lVar8;
  long lVar9;
  Cba_Ntk_t *p_04;
  long lVar10;
  int nFons;
  int nFins;
  int nObjs;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  pcVar7 = p->pSpec;
  pAVar5 = Abc_NamRef(p->pStrs);
  pFuns = Abc_NamRef(p->pFuns);
  pMods = Abc_NamStart(100,0x18);
  vHash = p->vHash;
  piVar6 = &vHash->nRefs;
  *piVar6 = *piVar6 + 1;
  p_01 = Cba_ManAlloc(pcVar7,1,pAVar5,pFuns,pMods,vHash);
  iVar2 = p->iRoot;
  if (((long)iVar2 < 1) || ((p->vNtks).nSize <= iVar2)) {
    p_04 = (Cba_Ntk_t *)0x0;
  }
  else {
    p_04 = (Cba_Ntk_t *)(p->vNtks).pArray[iVar2];
  }
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 1000;
  p_02->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_02->pArray = piVar6;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  memcpy(p_01->pTypeNames,p->pTypeNames,0x2d0);
  Cba_ManGetClpStats(p,&local_38,&local_3c,&local_40);
  p_03 = Cba_NtkAlloc(p_01,p_04->NameId,(p_04->vInputs).nSize,(p_04->vOutputs).nSize,local_38,
                      local_3c,local_40);
  pAVar5 = p_01->pMods;
  pcVar7 = Abc_NamStr(p_03->pDesign->pStrs,p_03->NameId);
  iVar2 = Abc_NamStrFindOrAdd(pAVar5,pcVar7,&local_34);
  if (local_34 == 0) {
    if (iVar2 != p_03->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                    ,0x264,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
    }
  }
  else {
    Abc_NamStr(p_03->pDesign->pStrs,p_03->NameId);
    printf("Network with name \"%s\" already exists.\n");
  }
  if (0 < (p_04->vObjName).nSize) {
    uVar3 = (p_03->vObjType).nCap;
    if ((p_03->vObjName).nCap < (int)uVar3) {
      piVar6 = (p_03->vObjName).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar3 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar3 << 2);
      }
      (p_03->vObjName).pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_00336f6f;
      (p_03->vObjName).nCap = uVar3;
    }
    if (0 < (int)uVar3) {
      memset((p_03->vObjName).pArray,0,(ulong)uVar3 * 4);
    }
    (p_03->vObjName).nSize = uVar3;
  }
  if (0 < (p_04->vFonName).nSize) {
    uVar3 = (p_03->vFonObj).nCap;
    if ((p_03->vFonName).nCap < (int)uVar3) {
      piVar6 = (p_03->vFonName).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar3 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar3 << 2);
      }
      (p_03->vFonName).pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_00336f6f;
      (p_03->vFonName).nCap = uVar3;
    }
    if (0 < (int)uVar3) {
      memset((p_03->vFonName).pArray,0,(ulong)uVar3 * 4);
    }
    (p_03->vFonName).nSize = uVar3;
  }
  if (0 < (p_04->vObjAttr).nSize) {
    uVar3 = (p_03->vObjType).nCap;
    if ((p_03->vObjAttr).nCap < (int)uVar3) {
      piVar6 = (p_03->vObjAttr).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar3 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar3 << 2);
      }
      (p_03->vObjAttr).pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_00336f6f;
      (p_03->vObjAttr).nCap = uVar3;
    }
    if (0 < (int)uVar3) {
      memset((p_03->vObjAttr).pArray,0,(ulong)uVar3 * 4);
    }
    (p_03->vObjAttr).nSize = uVar3;
    piVar6 = (p_03->vAttrSto).pArray;
    if ((p_03->vAttrSto).nCap < 1) {
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc(4);
      }
      else {
        piVar6 = (int *)realloc(piVar6,4);
      }
      (p_03->vAttrSto).pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_00336f6f;
      (p_03->vAttrSto).nCap = 1;
    }
    *piVar6 = -1;
    (p_03->vAttrSto).nSize = 1;
    if (0 < (p_04->vObjAttr).nSize) {
      p_00 = &p_04->vObjAttr;
      Vec_IntFillExtra(p_00,1,0);
      if ((p_04->vObjAttr).nSize < 1) goto LAB_00336eac;
      if (*(p_04->vObjAttr).pArray != 0) {
        Vec_IntFillExtra(p_00,1,0);
        if ((p_04->vObjAttr).nSize < 1) {
LAB_00336eac:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(p_04->vObjAttr).pArray == 0) {
          piVar6 = (int *)0x0;
        }
        else {
          Vec_IntFillExtra(p_00,1,0);
          if ((p_04->vObjAttr).nSize < 1) goto LAB_00336eac;
          iVar2 = *(p_04->vObjAttr).pArray;
          if ((iVar2 < -1) || (uVar3 = iVar2 + 1, (p_04->vAttrSto).nSize <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar6 = (p_04->vAttrSto).pArray + uVar3;
        }
        iVar2 = 0;
        Vec_IntFillExtra(p_00,1,0);
        if ((p_04->vObjAttr).nSize < 1) goto LAB_00336eac;
        if (*(p_04->vObjAttr).pArray != 0) {
          Vec_IntFillExtra(p_00,1,0);
          if ((p_04->vObjAttr).nSize < 1) goto LAB_00336eac;
          iVar2 = *(p_04->vObjAttr).pArray;
          if (((long)iVar2 < 0) || ((p_04->vAttrSto).nSize <= iVar2)) goto LAB_00336eac;
          iVar2 = (p_04->vAttrSto).pArray[iVar2];
        }
        Cba_ObjSetAttrs(p_03,0,piVar6,iVar2);
      }
    }
  }
  uVar3 = (p_04->vObjType).nCap;
  if ((p_04->vObjCopy).nCap < (int)uVar3) {
    piVar6 = (p_04->vObjCopy).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar3 << 2);
    }
    (p_04->vObjCopy).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_00336f6f:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_04->vObjCopy).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset((p_04->vObjCopy).pArray,0xff,(ulong)uVar3 * 4);
  }
  (p_04->vObjCopy).nSize = uVar3;
  iVar2 = (p_04->vInputs).nSize;
  if (0 < iVar2) {
    lVar10 = 0;
    do {
      iVar2 = (p_04->vInputs).pArray[lVar10];
      lVar9 = (long)iVar2;
      if (lVar9 < 1) {
LAB_00336ecb:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((p_04->vObjFon0).nSize <= iVar2) goto LAB_00336eac;
      uVar3 = (p_04->vObjFon0).pArray[lVar9];
      uVar4 = Cba_ObjDup(p_03,p_04,iVar2);
      if ((int)uVar4 < 1) goto LAB_00336ecb;
      if ((p_03->vObjFon0).nSize <= (int)uVar4) goto LAB_00336eac;
      Vec_IntPush(p_02,(p_03->vObjFon0).pArray[uVar4]);
      if (0 < (p_04->vObjName).nSize) {
        Vec_IntFillExtra(&p_04->vObjName,iVar2 + 1,0);
        if ((p_04->vObjName).nSize <= iVar2) goto LAB_00336eac;
        Cba_ObjSetName(p_03,uVar4,(p_04->vObjName).pArray[lVar9]);
      }
      if (0 < (p_04->vFonName).nSize) {
        if ((p_03->vObjFon0).nSize <= (int)uVar4) goto LAB_00336eac;
        if ((int)uVar3 < 1) goto LAB_00336f09;
        iVar1 = (p_03->vObjFon0).pArray[uVar4];
        Vec_IntFillExtra(&p_04->vFonName,uVar3 + 1,0);
        if ((p_04->vFonName).nSize <= (int)uVar3) goto LAB_00336eac;
        Cba_FonSetName(p_03,iVar1,(p_04->vFonName).pArray[uVar3]);
      }
      if (0 < (p_04->vObjAttr).nSize) {
        Vec_IntFillExtra(&p_04->vObjAttr,iVar2 + 1,0);
        if ((p_04->vObjAttr).nSize <= iVar2) goto LAB_00336eac;
        if ((p_04->vObjAttr).pArray[lVar9] != 0) {
          piVar6 = Cba_ObjAttrArray(p_04,iVar2);
          iVar2 = Cba_ObjAttrSize(p_04,iVar2);
          Cba_ObjSetAttrs(p_03,uVar4,piVar6,iVar2);
        }
      }
      lVar10 = lVar10 + 1;
      iVar2 = (p_04->vInputs).nSize;
    } while (lVar10 < iVar2);
  }
  if (p_02->nSize != iVar2) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPiNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x331,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  Cba_NtkCollapse_rec(p_03,p_04,p_02);
  if (p_02->nSize != (p_04->vOutputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPoNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x333,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  if (0 < p_02->nSize) {
    lVar10 = 0;
    do {
      iVar2 = (p_04->vOutputs).pArray[lVar10];
      lVar9 = (long)iVar2;
      if (lVar9 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16b,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((p_04->vObjFin0).nSize <= iVar2) goto LAB_00336eac;
      iVar1 = (p_04->vObjFin0).pArray[lVar9];
      if ((long)iVar1 < 1) {
LAB_00336eea:
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((p_04->vFinFon).nSize <= iVar1) goto LAB_00336eac;
      uVar3 = (p_04->vFinFon).pArray[iVar1];
      uVar4 = Cba_ObjDup(p_03,p_04,iVar2);
      if (p_02->nSize <= lVar10) goto LAB_00336eac;
      if ((int)uVar4 < 1) {
        pcVar7 = "i>0";
LAB_00336f38:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16e,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
      }
      if ((p_03->vObjFin0).nSize <= (int)uVar4) goto LAB_00336eac;
      iVar1 = (p_03->vObjFin0).pArray[uVar4];
      lVar8 = (long)iVar1;
      if (lVar8 < 1) goto LAB_00336eea;
      if ((p_03->vFinFon).nSize <= iVar1) goto LAB_00336eac;
      piVar6 = (p_03->vFinFon).pArray;
      if (piVar6[lVar8] != 0) {
        pcVar7 = "Cba_ObjFinFon(p, i, k)== 0";
        goto LAB_00336f38;
      }
      piVar6[lVar8] = p_02->pArray[lVar10];
      if (0 < (p_04->vObjName).nSize) {
        Vec_IntFillExtra(&p_04->vObjName,iVar2 + 1,0);
        if ((p_04->vObjName).nSize <= iVar2) goto LAB_00336eac;
        Cba_ObjSetName(p_03,uVar4,(p_04->vObjName).pArray[lVar9]);
      }
      if (0 < (p_04->vFonName).nSize) {
        if (p_02->nSize <= lVar10) goto LAB_00336eac;
        if ((int)uVar3 < 1) {
LAB_00336f09:
          __assert_fail("Cba_FonIsReal(f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        iVar1 = p_02->pArray[lVar10];
        Vec_IntFillExtra(&p_04->vFonName,uVar3 + 1,0);
        if ((p_04->vFonName).nSize <= (int)uVar3) goto LAB_00336eac;
        Cba_FonSetName(p_03,iVar1,(p_04->vFonName).pArray[uVar3]);
      }
      if (0 < (p_04->vObjAttr).nSize) {
        Vec_IntFillExtra(&p_04->vObjAttr,iVar2 + 1,0);
        if ((p_04->vObjAttr).nSize <= iVar2) goto LAB_00336eac;
        if ((p_04->vObjAttr).pArray[lVar9] != 0) {
          piVar6 = Cba_ObjAttrArray(p_04,iVar2);
          iVar2 = Cba_ObjAttrSize(p_04,iVar2);
          Cba_ObjSetAttrs(p_03,uVar4,piVar6,iVar2);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p_04->vOutputs).nSize);
  }
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  if ((p_03->vObjType).nSize != (p_03->vObjType).nCap) {
    __assert_fail("Cba_NtkObjNum(pRootNew) == Cba_NtkObjNumAlloc(pRootNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x340,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  if ((p_03->vFinFon).nSize != (p_03->vFinFon).nCap) {
    __assert_fail("Cba_NtkFinNum(pRootNew) == Cba_NtkFinNumAlloc(pRootNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x341,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  if ((p_03->vFonObj).nSize == (p_03->vFonObj).nCap) {
    Cba_NtkMissingFonNames(p_03,"m");
    return p_01;
  }
  __assert_fail("Cba_NtkFonNum(pRootNew) == Cba_NtkFonNumAlloc(pRootNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                ,0x342,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
}

Assistant:

Cba_Man_t * Cba_ManCollapse( Cba_Man_t * p )
{
    Cba_Man_t * pNew  = Cba_ManAlloc( p->pSpec, 1, Abc_NamRef(p->pStrs), Abc_NamRef(p->pFuns), Abc_NamStart(100, 24), Hash_IntManRef(p->vHash) );
    Cba_Ntk_t * pRoot = Cba_ManRoot( p ), * pRootNew;
    Vec_Int_t * vSigs = Vec_IntAlloc( 1000 );
    int i, iObj, iObjNew, iFon, nObjs = 0, nFins = 0, nFons = 0;
    Cba_ManDupTypeNames( pNew, p );
    Cba_ManGetClpStats( p, &nObjs, &nFins, &nFons    );
    pRootNew = Cba_NtkAlloc( pNew, Cba_NtkNameId(pRoot), Cba_NtkPiNum(pRoot), Cba_NtkPoNum(pRoot), nObjs, nFins, nFons );
    Cba_NtkAdd( pNew, pRootNew );
    if ( Cba_NtkHasObjNames(pRoot) )
        Cba_NtkCleanObjNames( pRootNew );
    if ( Cba_NtkHasFonNames(pRoot) )
        Cba_NtkCleanFonNames( pRootNew );
    if ( Cba_NtkHasObjAttrs(pRoot) )
        Cba_NtkCleanObjAttrs( pRootNew );
    if ( Cba_ObjAttr(pRoot, 0) )
        Cba_ObjSetAttrs( pRootNew, 0, Cba_ObjAttrArray(pRoot, 0), Cba_ObjAttrSize(pRoot, 0) );
    Cba_NtkCleanObjCopies( pRoot );
    Cba_NtkForEachPiFon( pRoot, iObj, iFon, i )
    {
        iObjNew = Cba_ObjDup( pRootNew, pRoot, iObj );
        Vec_IntPush( vSigs, Cba_ObjFon0(pRootNew, iObjNew) );
        if ( Cba_NtkHasObjNames(pRoot) )
            Cba_ObjSetName( pRootNew, iObjNew, Cba_ObjName(pRoot, iObj) );
        if ( Cba_NtkHasFonNames(pRoot) )
            Cba_FonSetName( pRootNew, Cba_ObjFon0(pRootNew, iObjNew), Cba_FonName(pRoot, iFon) );
        if ( Cba_ObjAttr(pRoot, iObj) )
            Cba_ObjSetAttrs( pRootNew, iObjNew, Cba_ObjAttrArray(pRoot, iObj), Cba_ObjAttrSize(pRoot, iObj) );
    }
    assert( Vec_IntSize(vSigs) == Cba_NtkPiNum(pRoot) );
    Cba_NtkCollapse_rec( pRootNew, pRoot, vSigs );
    assert( Vec_IntSize(vSigs) == Cba_NtkPoNum(pRoot) );
    Cba_NtkForEachPoDriverFon( pRoot, iObj, iFon, i )
    {
        iObjNew = Cba_ObjDup( pRootNew, pRoot, iObj );
        Cba_ObjSetFinFon( pRootNew, iObjNew, 0, Vec_IntEntry(vSigs, i) );
        if ( Cba_NtkHasObjNames(pRoot) )
            Cba_ObjSetName( pRootNew, iObjNew, Cba_ObjName(pRoot, iObj) );
        if ( Cba_NtkHasFonNames(pRoot) )
            Cba_FonSetName( pRootNew, Vec_IntEntry(vSigs, i), Cba_FonName(pRoot, iFon) );
        if ( Cba_ObjAttr(pRoot, iObj) )
            Cba_ObjSetAttrs( pRootNew, iObjNew, Cba_ObjAttrArray(pRoot, iObj), Cba_ObjAttrSize(pRoot, iObj) );
    }
    Vec_IntFree( vSigs );
    assert( Cba_NtkObjNum(pRootNew) == Cba_NtkObjNumAlloc(pRootNew) );
    assert( Cba_NtkFinNum(pRootNew) == Cba_NtkFinNumAlloc(pRootNew) );
    assert( Cba_NtkFonNum(pRootNew) == Cba_NtkFonNumAlloc(pRootNew) );
    // create internal node names
    Cba_NtkMissingFonNames( pRootNew, "m" );
    //Cba_NtkPrepareSeq( pRootNew );
    return pNew;
}